

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_true,_false>::delete_block_link_
          (DaTrie<true,_true,_false> *this,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  reference pvVar4;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint32_t next;
  uint32_t prev;
  
  sVar3 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::size(in_RDX);
  if (in_ESI < sVar3) {
    pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                       (in_RDX,(ulong)in_ESI);
    if (pvVar4->next == in_ESI) {
      *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
    }
    else {
      if (in_ESI == *(uint *)(in_RDI + 0x60)) {
        pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                           (in_RDX,(ulong)in_ESI);
        *(uint32_t *)(in_RDI + 0x60) = pvVar4->next;
      }
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)in_ESI);
      uVar1 = pvVar4->prev;
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)in_ESI);
      uVar2 = pvVar4->next;
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)uVar1);
      pvVar4->next = uVar2;
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)uVar2);
      pvVar4->prev = uVar1;
    }
    return;
  }
  __assert_fail("block_pos < blocks.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x4f6,
                "void ddd::DaTrie<true, true, false>::delete_block_link_(uint32_t, std::vector<BlockLink> &) [WithBLM = true, WithNLM = true, Prefix = false]"
               );
}

Assistant:

void delete_block_link_(uint32_t block_pos, std::vector<BlockLink>& blocks) {
    assert(block_pos < blocks.size());

    if (blocks[block_pos].next == block_pos) {
      head_pos_ = NOT_FOUND;
      return;
    }

    if (block_pos == head_pos_) {
      head_pos_ = blocks[block_pos].next;
    }

    auto prev = blocks[block_pos].prev;
    auto next = blocks[block_pos].next;
    blocks[prev].next = next;
    blocks[next].prev = prev;
  }